

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O1

void kratos::hash_generators_context(Context *context,Generator *root,HashStrategy strategy)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  Generator **this_00;
  Generator *pGVar1;
  bool bVar2;
  undefined8 uVar3;
  pointer ppVar4;
  int iVar5;
  uint32_t uVar6;
  uint uVar7;
  undefined4 extraout_var;
  uint64_t hash;
  ulong uVar8;
  Generator **node_1;
  pointer *pppGVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  ulong uVar10;
  Generator **node;
  undefined1 __args [8];
  undefined1 local_1d0 [8];
  thread_pool pool;
  GeneratorGraph g;
  future<unsigned_long> task;
  vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_> thread_tasks;
  undefined1 auStack_88 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> hash_values;
  undefined1 local_60 [8];
  vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
  levels;
  vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> list;
  
  if (context->track_generated_ == false) {
    std::
    _Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(context->generator_hash_)._M_h);
  }
  GeneratorGraph::GeneratorGraph
            ((GeneratorGraph *)&pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next,
             root);
  if (strategy == ParallelHash) {
    uVar6 = get_num_cpus();
    cxxpool::thread_pool::thread_pool((thread_pool *)local_1d0,(ulong)uVar6);
    GeneratorGraph::get_leveled_nodes
              ((vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                *)local_60,
               (GeneratorGraph *)
               &pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next);
    uVar7 = (int)((ulong)((long)levels.
                                super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start - (long)local_60) >> 3) *
            -0x55555555 - 1;
    if (-1 < (int)uVar7) {
      this = &task.super___basic_future<unsigned_long>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
      this_00 = &g.root_;
      uVar8 = (ulong)uVar7;
      do {
        std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::vector
                  ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                   &levels.
                    super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                   ((long)local_60 + uVar8 * 3 * 8));
        auStack_88 = (undefined1  [8])0x0;
        hash_values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        hash_values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        task.super___basic_future<unsigned_long>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>::
        reserve((vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_> *)
                this,(long)list.
                           super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                           ._M_impl.super__Vector_impl_data._M_start -
                     (long)levels.
                           super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3);
        for (pppGVar9 = (pointer *)
                        levels.
                        super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            this_01._M_pi =
                 task.super___basic_future<unsigned_long>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi,
            (pointer)pppGVar9 !=
            list.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
            _M_impl.super__Vector_impl_data._M_start; pppGVar9 = pppGVar9 + 1) {
          cxxpool::thread_pool::push<unsigned_long(&)(kratos::Generator*),kratos::Generator*const&>
                    ((thread_pool *)this_00,(size_t)local_1d0,
                     (_func_unsigned_long_Generator_ptr *)0x0,(Generator **)hash_generator);
          std::vector<std::future<unsigned_long>,std::allocator<std::future<unsigned_long>>>::
          emplace_back<std::future<unsigned_long>>
                    ((vector<std::future<unsigned_long>,std::allocator<std::future<unsigned_long>>>
                      *)this,(future<unsigned_long> *)this_00);
          if (task.super___basic_future<unsigned_long>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       task.super___basic_future<unsigned_long>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
          }
        }
        for (; this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this_01._M_pi = this_01._M_pi + 1) {
          g.root_ = (Generator *)
                    std::future<unsigned_long>::get((future<unsigned_long> *)this_01._M_pi);
          if (hash_values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start ==
              hash_values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_88,
                       (iterator)
                       hash_values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_start,(unsigned_long *)this_00);
          }
          else {
            *hash_values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start = (unsigned_long)g.root_;
            hash_values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start =
                 hash_values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        if ((pointer)list.
                     super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                     _M_impl.super__Vector_impl_data._M_start !=
            levels.
            super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          uVar10 = 0;
          do {
            Context::add_hash(context,(Generator *)
                                      (&((levels.
                                          super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                        super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start)[uVar10],
                              *(uint64_t *)((long)auStack_88 + uVar10 * 8));
            uVar10 = uVar10 + 1;
          } while (uVar10 < (ulong)((long)list.
                                          super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start -
                                    (long)levels.
                                          super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3));
        }
        std::vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>::
        ~vector((vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_> *)
                this);
        if (auStack_88 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_88,
                          (long)hash_values.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)auStack_88);
        }
        if (levels.
            super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          operator_delete(levels.
                          super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)list.
                                super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)levels.
                                super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        bVar2 = 0 < (long)uVar8;
        uVar8 = uVar8 - 1;
      } while (bVar2);
    }
    std::
    vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
    ::~vector((vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
               *)local_60);
    cxxpool::thread_pool::~thread_pool((thread_pool *)local_1d0);
  }
  else if (strategy == SequentialHash) {
    GeneratorGraph::get_sorted_nodes
              ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)local_60,
               (GeneratorGraph *)
               &pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next);
    levels.
    super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::reserve
              ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
               &levels.
                super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (long)levels.
                     super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)local_60 >> 3);
    pppGVar9 = (pointer *)
               levels.
               super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (local_60 !=
        (undefined1  [8])
        levels.
        super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __args = local_60;
      do {
        pGVar1 = *(Generator **)__args;
        if (((pGVar1->lib_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (pGVar1->lib_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) && ((pGVar1->is_external_ & 1U) == 0)) {
          Context::get_generators_by_name
                    ((set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                      *)local_1d0,context,&(*(Generator **)__args)->name);
          ppVar4 = pool.tasks_.c.
                   super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::
          _Rb_tree<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::_Identity<std::shared_ptr<kratos::Generator>_>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
          ::~_Rb_tree((_Rb_tree<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::_Identity<std::shared_ptr<kratos::Generator>_>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                       *)local_1d0);
          pGVar1 = *(Generator **)__args;
          if (ppVar4 == (pointer)0x1) {
            hash_generator_name(context,pGVar1);
          }
          else {
            iVar5 = (*(pGVar1->super_IRNode)._vptr_IRNode[4])(pGVar1);
            if ((CONCAT44(extraout_var,iVar5) != 0) || (*(Generator **)__args == root)) {
              std::vector<kratos::Generator*,std::allocator<kratos::Generator*>>::
              emplace_back<kratos::Generator*const&>
                        ((vector<kratos::Generator*,std::allocator<kratos::Generator*>> *)
                         &levels.
                          super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(Generator **)__args);
            }
          }
        }
        else {
          Generator::external_filename_abi_cxx11_((string *)local_1d0,*(Generator **)__args);
          uVar3 = pool._0_8_;
          if (local_1d0 != (undefined1  [8])&pool.threads_) {
            operator_delete((void *)local_1d0,
                            (ulong)((long)&((pool.threads_.
                                             super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_id).
                                           _M_thread + 1));
          }
          if (uVar3 != 0) {
            hash_generator_src(context,*(Generator **)__args);
          }
        }
        __args = (undefined1  [8])((long)__args + 8);
        pppGVar9 = (pointer *)
                   levels.
                   super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
      } while (__args != (undefined1  [8])
                         levels.
                         super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    }
    for (; (pointer)pppGVar9 != (pointer)0x0; pppGVar9 = pppGVar9 + 1) {
      hash = hash_generator((Generator *)*pppGVar9);
      Context::add_hash(context,(Generator *)*pppGVar9,hash);
    }
    if (levels.
        super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(levels.
                      super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      -(long)levels.
                             super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (local_60 != (undefined1  [8])0x0) {
      operator_delete((void *)local_60,
                      (long)levels.
                            super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)local_60);
    }
  }
  std::
  _Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next);
  return;
}

Assistant:

void hash_generators_context(Context* context, Generator* root, HashStrategy strategy) {
    // clear the hash first
    if (!context->track_generated()) context->clear_hash();

    // compute the generator graph
    GeneratorGraph g(root);
    // if it's sequential, do topological sort
    // if it's parallel, do level sort

    if (strategy == HashStrategy::SequentialHash) {
        auto const& sequence = g.get_sorted_nodes();
        std::vector<Generator*> list;
        // reserve for list
        list.reserve(sequence.size());

        for (auto const& node : sequence) {
            // different cases
            if (node->external()) {
                if (node->external_filename().empty()) {
                    // user marked external file, skip it
                    continue;
                } else {
                    hash_generator_src(context, node);
                }
            } else if (context->get_generators_by_name(node->name).size() == 1) {
                // just need to hash the name
                hash_generator_name(context, node);
            } else {
                // only the one being used
                if (node->parent() == nullptr && node != root) continue;
                list.emplace_back(node);
            }
        }
        for (auto const& node : list) {
            uint64_t hash = hash_generator(node);
            context->add_hash(node, hash);
        }
    } else if (strategy == HashStrategy::ParallelHash) {
        uint32_t num_cpus = get_num_cpus();
        cxxpool::thread_pool pool{num_cpus};

        auto levels = g.get_leveled_nodes();
        // we proceed in a reversed order
        for (int i = static_cast<int>(levels.size() - 1); i >= 0; i--) {
            auto list = levels[i];
            std::vector<uint64_t> hash_values;
            std::vector<std::future<uint64_t>> thread_tasks;
            thread_tasks.reserve(list.size());

            for (auto const& node : list) {
                auto task = pool.push(hash_generator, node);
                thread_tasks.emplace_back(std::move(task));
            }

            cxxpool::get(thread_tasks.begin(), thread_tasks.end(), hash_values);
            for (uint64_t j = 0; j < list.size(); j++) {
                auto const& node = list[j];
                auto const hash = hash_values[j];
                context->add_hash(node, hash);
            }
        }
    }
}